

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerHLSL::to_interpolation_qualifiers_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,Bitset *flags)

{
  uint uVar1;
  undefined8 in_RAX;
  const_iterator cVar2;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uStack_28 = in_RAX;
  if ((flags->lower & 0x4000) == 0) {
    uStack_28 = CONCAT44(0x14a5,(int)in_RAX);
    cVar2 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(flags->higher)._M_h,(key_type *)((long)&uStack_28 + 4));
    if (cVar2.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0)
    goto LAB_001a82ae;
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_001a82ae:
  uVar1 = (uint)flags->lower;
  if ((uVar1 >> 0xd & 1) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar1 = (uint)flags->lower;
  }
  if ((uVar1 >> 0x10 & 1) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar1 = (uint)flags->lower;
  }
  if ((short)uVar1 < 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar1 = (uint)flags->lower;
  }
  if ((uVar1 >> 0x11 & 1) != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar1 = (uint)flags->lower;
  }
  if (((uVar1 >> 0x12 & 1) != 0) &&
     ((this->super_CompilerGLSL).backend.support_precise_qualifier == true)) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::to_interpolation_qualifiers(const Bitset &flags)
{
	string res;
	//if (flags & (1ull << DecorationSmooth))
	//    res += "linear ";
	if (flags.get(DecorationFlat) || flags.get(DecorationPerVertexKHR))
		res += "nointerpolation ";
	if (flags.get(DecorationNoPerspective))
		res += "noperspective ";
	if (flags.get(DecorationCentroid))
		res += "centroid ";
	if (flags.get(DecorationPatch))
		res += "patch "; // Seems to be different in actual HLSL.
	if (flags.get(DecorationSample))
		res += "sample ";
	if (flags.get(DecorationInvariant) && backend.support_precise_qualifier)
		res += "precise "; // Not supported?

	return res;
}